

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O1

void __thiscall pstack::Procman::StackFrame::getCoreRegs(StackFrame *this,CoreRegisters *core)

{
  core->rax = (this->regs).rax;
  core->rdx = (this->regs).rdx;
  core->rcx = (this->regs).rcx;
  core->rbx = (this->regs).rbx;
  core->rsi = (this->regs).rsi;
  core->rdi = (this->regs).rdi;
  core->rbp = (this->regs).rbp;
  core->rsp = (this->regs).rsp;
  core->r8 = (this->regs).r8;
  core->r9 = (this->regs).r9;
  core->r10 = (this->regs).r10;
  core->r11 = (this->regs).r11;
  core->r12 = (this->regs).r12;
  core->r13 = (this->regs).r13;
  core->r14 = (this->regs).r14;
  core->r15 = (this->regs).r15;
  core->rip = (this->regs).rip;
  core->eflags = (this->regs).eflags;
  core->es = (this->regs).es;
  core->cs = (this->regs).cs;
  core->ss = (this->regs).ss;
  core->ds = (this->regs).ds;
  core->fs = (this->regs).fs;
  core->gs = (this->regs).gs;
  core->fs_base = (this->regs).fs_base;
  core->gs_base = (this->regs).gs_base;
  return;
}

Assistant:

void
StackFrame::getCoreRegs(Elf::CoreRegisters &core) const
{
#define REGMAP(number, field) core.field = Elf::getReg(regs, number);
#include "libpstack/archreg.h"
#undef REGMAP
}